

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap_client.cpp
# Opt level: O0

void __thiscall
zmq::zap_client_t::send_zap_request
          (zap_client_t *this,char *mechanism_,size_t mechanism_length_,uint8_t **credentials_,
          size_t *credentials_sizes_,size_t credentials_count_)

{
  undefined2 *puVar1;
  undefined1 *puVar2;
  msg_t *this_00;
  msg_t *msg_;
  size_t sVar3;
  void *pvVar4;
  void *__src;
  int *piVar5;
  char *pcVar6;
  long in_RCX;
  size_t in_RDX;
  EVP_PKEY_CTX *in_RSI;
  session_base_t *in_RDI;
  long in_R8;
  ulong in_R9;
  char *errstr_15;
  char *errstr_14;
  size_t i;
  char *errstr_13;
  char *errstr_12;
  char *errstr_11;
  char *errstr_10;
  char *errstr_9;
  char *errstr_8;
  char *errstr_7;
  char *errstr_6;
  char *errstr_5;
  char *errstr_4;
  char *errstr_3;
  char *errstr_2;
  char *errstr_1;
  char *errstr;
  msg_t msg;
  int rc;
  size_t in_stack_fffffffffffffee0;
  msg_t *in_stack_fffffffffffffee8;
  msg_t *in_stack_fffffffffffffef0;
  ulong local_f0;
  msg_t local_78;
  int local_34;
  ulong local_30;
  long local_28;
  long local_20;
  size_t local_18;
  EVP_PKEY_CTX *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_34 = msg_t::init(&local_78,in_RSI);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x4b);
    fflush(_stderr);
    zmq_abort((char *)0x31e988);
  }
  msg_t::set_flags(&local_78,'\x01');
  local_34 = session_base_t::write_zap_msg(in_RDI,in_stack_fffffffffffffef0);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x4e);
    fflush(_stderr);
    zmq_abort((char *)0x31ea34);
  }
  local_34 = msg_t::init_size(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x52);
    fflush(_stderr);
    zmq_abort((char *)0x31eabf);
  }
  puVar1 = (undefined2 *)msg_t::data(in_stack_fffffffffffffee8);
  *puVar1 = 0x2e31;
  *(undefined1 *)(puVar1 + 1) = 0x30;
  msg_t::set_flags(&local_78,'\x01');
  local_34 = session_base_t::write_zap_msg(in_RDI,in_stack_fffffffffffffef0);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x56);
    fflush(_stderr);
    zmq_abort((char *)0x31eb8b);
  }
  local_34 = msg_t::init_size(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x5a);
    fflush(_stderr);
    zmq_abort((char *)0x31ec16);
  }
  puVar2 = (undefined1 *)msg_t::data(in_stack_fffffffffffffee8);
  *puVar2 = 0x31;
  msg_t::set_flags(&local_78,'\x01');
  local_34 = session_base_t::write_zap_msg(in_RDI,in_stack_fffffffffffffef0);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x5e);
    fflush(_stderr);
    zmq_abort((char *)0x31ecd7);
  }
  std::__cxx11::string::length();
  local_34 = msg_t::init_size(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x62);
    fflush(_stderr);
    zmq_abort((char *)0x31ed73);
  }
  this_00 = (msg_t *)msg_t::data(in_stack_fffffffffffffee8);
  msg_ = (msg_t *)std::__cxx11::string::c_str();
  sVar3 = std::__cxx11::string::length();
  memcpy(this_00,msg_,sVar3);
  msg_t::set_flags(&local_78,'\x01');
  local_34 = session_base_t::write_zap_msg(in_RDI,msg_);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x67);
    fflush(_stderr);
    zmq_abort((char *)0x31ee77);
  }
  std::__cxx11::string::length();
  local_34 = msg_t::init_size(this_00,in_stack_fffffffffffffee0);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x6b);
    fflush(_stderr);
    zmq_abort((char *)0x31ef05);
  }
  pvVar4 = msg_t::data(this_00);
  __src = (void *)std::__cxx11::string::c_str();
  sVar3 = std::__cxx11::string::length();
  memcpy(pvVar4,__src,sVar3);
  msg_t::set_flags(&local_78,'\x01');
  local_34 = session_base_t::write_zap_msg(in_RDI,msg_);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x6f);
    fflush(_stderr);
    zmq_abort((char *)0x31efeb);
  }
  local_34 = msg_t::init_size(this_00,(size_t)__src);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x73);
    fflush(_stderr);
    zmq_abort((char *)0x31f07b);
  }
  pvVar4 = msg_t::data(this_00);
  memcpy(pvVar4,(in_RDI->super_own_t).options.routing_id +
                (long)((in_RDI->super_own_t).super_object_t._vptr_object_t[-3] + -0x10),
         (ulong)(in_RDI->super_own_t).options.routing_id
                [(long)((in_RDI->super_own_t).super_object_t._vptr_object_t[-3] + -0x11)]);
  msg_t::set_flags(&local_78,'\x01');
  local_34 = session_base_t::write_zap_msg(in_RDI,msg_);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x77);
    fflush(_stderr);
    zmq_abort((char *)0x31f158);
  }
  local_34 = msg_t::init_size(this_00,(size_t)__src);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x7b);
    fflush(_stderr);
    zmq_abort((char *)0x31f1dd);
  }
  pvVar4 = msg_t::data(this_00);
  memcpy(pvVar4,local_10,local_18);
  if (local_30 != 0) {
    msg_t::set_flags(&local_78,'\x01');
  }
  local_34 = session_base_t::write_zap_msg(in_RDI,msg_);
  if (local_34 != 0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
            ,0x80);
    fflush(_stderr);
    zmq_abort((char *)0x31f2b0);
  }
  for (local_f0 = 0; local_f0 < local_30; local_f0 = local_f0 + 1) {
    local_34 = msg_t::init_size(this_00,(size_t)__src);
    if (local_34 != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
              ,0x85);
      fflush(_stderr);
      zmq_abort((char *)0x31f35a);
    }
    if (local_f0 < local_30 - 1) {
      msg_t::set_flags(&local_78,'\x01');
    }
    pvVar4 = msg_t::data(this_00);
    memcpy(pvVar4,*(void **)(local_20 + local_f0 * 8),*(size_t *)(local_28 + local_f0 * 8));
    local_34 = session_base_t::write_zap_msg(in_RDI,msg_);
    if (local_34 != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar6,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/zap_client.cpp"
              ,0x8a);
      fflush(_stderr);
      zmq_abort((char *)0x31f44a);
    }
  }
  return;
}

Assistant:

void zap_client_t::send_zap_request (const char *mechanism_,
                                     size_t mechanism_length_,
                                     const uint8_t **credentials_,
                                     size_t *credentials_sizes_,
                                     size_t credentials_count_)
{
    // write_zap_msg cannot fail. It could only fail if the HWM was exceeded,
    // but on the ZAP socket, the HWM is disabled.

    int rc;
    msg_t msg;

    //  Address delimiter frame
    rc = msg.init ();
    errno_assert (rc == 0);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Version frame
    rc = msg.init_size (zap_version_len);
    errno_assert (rc == 0);
    memcpy (msg.data (), zap_version, zap_version_len);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Request ID frame
    rc = msg.init_size (id_len);
    errno_assert (rc == 0);
    memcpy (msg.data (), id, id_len);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Domain frame
    rc = msg.init_size (options.zap_domain.length ());
    errno_assert (rc == 0);
    memcpy (msg.data (), options.zap_domain.c_str (),
            options.zap_domain.length ());
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Address frame
    rc = msg.init_size (peer_address.length ());
    errno_assert (rc == 0);
    memcpy (msg.data (), peer_address.c_str (), peer_address.length ());
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Routing id frame
    rc = msg.init_size (options.routing_id_size);
    errno_assert (rc == 0);
    memcpy (msg.data (), options.routing_id, options.routing_id_size);
    msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Mechanism frame
    rc = msg.init_size (mechanism_length_);
    errno_assert (rc == 0);
    memcpy (msg.data (), mechanism_, mechanism_length_);
    if (credentials_count_)
        msg.set_flags (msg_t::more);
    rc = session->write_zap_msg (&msg);
    errno_assert (rc == 0);

    //  Credentials frames
    for (size_t i = 0; i < credentials_count_; ++i) {
        rc = msg.init_size (credentials_sizes_[i]);
        errno_assert (rc == 0);
        if (i < credentials_count_ - 1)
            msg.set_flags (msg_t::more);
        memcpy (msg.data (), credentials_[i], credentials_sizes_[i]);
        rc = session->write_zap_msg (&msg);
        errno_assert (rc == 0);
    }
}